

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O1

bool __thiscall pbrt::TransformedPrimitive::IntersectP(TransformedPrimitive *this,Ray *r,Float tMax)

{
  float fVar1;
  undefined8 uVar2;
  Transform *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  undefined1 auVar6 [16];
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  Point3fi o;
  Point3fi local_c8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Ray local_50;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  fVar15 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar7._4_4_ = fVar15;
  auVar7._0_4_ = fVar15;
  auVar7._8_4_ = fVar15;
  auVar7._12_4_ = fVar15;
  this_00 = *(Transform **)(this + 8);
  fVar15 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar6._4_4_ = fVar15;
  auVar6._0_4_ = fVar15;
  auVar6._8_4_ = fVar15;
  auVar6._12_4_ = fVar15;
  auVar7 = vmovlhps_avx(auVar7,auVar6);
  fVar15 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar12._4_4_ = fVar15;
  auVar12._0_4_ = fVar15;
  auVar12._8_4_ = fVar15;
  auVar12._12_4_ = fVar15;
  local_50.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar7._0_8_;
  local_50.o.super_Tuple3<pbrt::Point3,_float>.z = auVar7._8_4_;
  local_50.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar7._12_4_;
  uVar2 = vmovlps_avx(auVar12);
  local_50.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar2;
  local_50.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)((ulong)uVar2 >> 0x20);
  Transform::ApplyInverse(&local_c8,this_00,(Point3fi *)&local_50);
  fVar15 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar1 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar11 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this_00->mInv).m[0][1])),ZEXT416((uint)fVar15),
                           ZEXT416((uint)(this_00->mInv).m[0][0]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar11),ZEXT416((uint)(this_00->mInv).m[0][2]));
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this_00->mInv).m[1][1])),ZEXT416((uint)fVar15),
                           ZEXT416((uint)(this_00->mInv).m[1][0]));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar11),ZEXT416((uint)(this_00->mInv).m[1][2]));
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this_00->mInv).m[2][1])),ZEXT416((uint)fVar15),
                            ZEXT416((uint)(this_00->mInv).m[2][0]));
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar11),ZEXT416((uint)(this_00->mInv).m[2][2]));
  fVar15 = auVar6._0_4_;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar15)),auVar7,auVar7);
  auVar4 = vfmadd231ss_fma(auVar4,auVar12,auVar12);
  if (0.0 < auVar4._0_4_) {
    auVar14._8_4_ = 0x7fffffff;
    auVar14._0_8_ = 0x7fffffff7fffffff;
    auVar14._12_4_ = 0x7fffffff;
    auVar3 = vandps_avx(auVar7,auVar14);
    auVar13 = vandps_avx(auVar6,auVar14);
    auVar14 = vandps_avx(auVar12,auVar14);
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ *
                                           (local_c8.super_Point3<pbrt::Interval<float>_>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                            high - local_c8.super_Point3<pbrt::Interval<float>_>.
                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) * 0.5)),
                             ZEXT416((uint)((local_c8.super_Point3<pbrt::Interval<float>_>.
                                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
                                             high - local_c8.super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low) * 0.5)),auVar3);
    auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)((local_c8.super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .z.high - local_c8.
                                                  super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .z.low) * 0.5)),auVar14);
    fVar11 = auVar3._0_4_ / auVar4._0_4_;
    fVar1 = auVar7._0_4_ * fVar11;
    local_a8 = ZEXT416((uint)(fVar15 * fVar11));
    local_98 = ZEXT416((uint)(auVar12._0_4_ * fVar11));
    i.high = fVar1;
    i.low = fVar1;
    local_88 = auVar6;
    local_78 = auVar7;
    local_68 = auVar12;
    auVar8._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_c8,i);
    auVar8._8_56_ = extraout_var;
    uVar2 = vmovlps_avx(auVar8._0_16_);
    local_c8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.low = (float)uVar2;
    local_c8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.high = (float)((ulong)uVar2 >> 0x20);
    i_00.high = (float)local_a8._0_4_;
    i_00.low = (float)local_a8._0_4_;
    auVar9._0_8_ = Interval<float>::operator+<float>
                             (&local_c8.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
    auVar9._8_56_ = extraout_var_00;
    uVar2 = vmovlps_avx(auVar9._0_16_);
    local_c8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.low = (float)uVar2;
    local_c8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.high = (float)((ulong)uVar2 >> 0x20);
    i_01.high = (float)local_98._0_4_;
    i_01.low = (float)local_98._0_4_;
    auVar10._0_8_ =
         Interval<float>::operator+<float>
                   (&local_c8.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
    auVar10._8_56_ = extraout_var_01;
    local_c8.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .z = (Interval<float>)vmovlps_avx(auVar10._0_16_);
    tMax = tMax - fVar11;
    auVar7 = local_78;
    auVar6 = local_88;
    auVar12 = local_68;
  }
  auVar7 = vinsertps_avx(auVar7,auVar6,0x10);
  auVar3._4_4_ = local_c8.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar3._0_4_ = local_c8.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar3._8_4_ = local_c8.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar3._12_4_ =
       local_c8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  local_50.o.super_Tuple3<pbrt::Point3,_float>.z =
       (local_c8.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
       local_c8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  local_50.time = r->time;
  local_50.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(r->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar6 = vinsertps_avx(auVar3,ZEXT416((uint)local_c8.super_Point3<pbrt::Interval<float>_>.
                                              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                              high),0x10);
  auVar13._0_4_ =
       local_c8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar6._0_4_;
  auVar13._4_4_ =
       local_c8.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar6._4_4_;
  auVar13._8_4_ = auVar6._8_4_ + 0.0;
  auVar13._12_4_ = auVar6._12_4_ + 0.0;
  auVar4._8_4_ = 0x3f000000;
  auVar4._0_8_ = 0x3f0000003f000000;
  auVar4._12_4_ = 0x3f000000;
  auVar6 = vmulps_avx512vl(auVar13,auVar4);
  local_50.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar6);
  uVar2 = vmovlps_avx(auVar7);
  local_50.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
  local_50.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar2 >> 0x20);
  local_50.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar12._0_4_;
  bVar5 = PrimitiveHandle::IntersectP((PrimitiveHandle *)this,&local_50,tMax);
  return bVar5;
}

Assistant:

bool TransformedPrimitive::IntersectP(const Ray &r, Float tMax) const {
    Ray ray = renderFromPrimitive->ApplyInverse(r, &tMax);
    return primitive.IntersectP(ray, tMax);
}